

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_write_coc(opj_j2k_t *j2k,int compno)

{
  opj_cio_t *cio_00;
  int pos;
  int iVar1;
  opj_cio_t *cio_01;
  undefined4 in_ESI;
  long in_RDI;
  opj_cio_t *cio;
  opj_image_t *image;
  opj_tcp_t *tcp;
  opj_cp_t *cp;
  int len;
  int lenp;
  int n;
  unsigned_long_long v;
  int in_stack_ffffffffffffffec;
  
  cio_01 = (opj_cio_t *)
           (*(long *)(*(long *)(in_RDI + 0x60) + 0x80) + (long)*(int *)(in_RDI + 0xc) * 0x15e8);
  v = *(unsigned_long_long *)(in_RDI + 0x58);
  cio_00 = *(opj_cio_t **)(in_RDI + 0x70);
  n = (int)((ulong)cio_00 >> 0x20);
  cio_write(cio_01,v,n);
  pos = cio_tell(cio_00);
  cio_skip(cio_00,2);
  cio_write(cio_01,v,n);
  cio_write(cio_01,v,n);
  j2k_write_cox((opj_j2k_t *)CONCAT44(in_ESI,pos),in_stack_ffffffffffffffec);
  iVar1 = cio_tell(cio_00);
  iVar1 = iVar1 - pos;
  cio_seek(cio_00,pos);
  cio_write(cio_01,v,n);
  cio_seek(cio_00,pos + iVar1);
  return;
}

Assistant:

static void j2k_write_coc(opj_j2k_t *j2k, int compno) {
	int lenp, len;

	opj_cp_t *cp = j2k->cp;
	opj_tcp_t *tcp = &cp->tcps[j2k->curtileno];
	opj_image_t *image = j2k->image;
	opj_cio_t *cio = j2k->cio;
	
	cio_write(cio, J2K_MS_COC, 2);	/* COC */
	lenp = cio_tell(cio);
	cio_skip(cio, 2);
	cio_write(cio, compno, image->numcomps <= 256 ? 1 : 2);	/* Ccoc */
	cio_write(cio, tcp->tccps[compno].csty, 1);	/* Scoc */
	j2k_write_cox(j2k, compno);
	len = cio_tell(cio) - lenp;
	cio_seek(cio, lenp);
	cio_write(cio, len, 2);			/* Lcoc */
	cio_seek(cio, lenp + len);
}